

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O3

void pnga_dot(int Type,Integer g_a,Integer g_b,void *value)

{
  float fVar1;
  float fVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 (*x) [16];
  Integer grp;
  Integer IVar10;
  Integer IVar11;
  Integer IVar12;
  logical lVar13;
  long lVar14;
  ARMCI_Group *group;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int scope;
  long lVar19;
  int type_00;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Integer type;
  void *ptr_b;
  void *ptr_a;
  Integer ndim;
  undefined1 (*local_130) [16];
  Integer _hi [7];
  Integer _lo [7];
  Integer _ld [6];
  Integer _dims [7];
  
  ndim = 0;
  type = 0;
  ptr_a = (void *)0x0;
  ptr_b = (void *)0x0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_130 = (undefined1 (*) [16])value;
  grp = pnga_get_pgroup(g_a);
  IVar10 = pnga_get_pgroup(g_b);
  if (grp != IVar10) {
    pnga_error("Both arrays must be defined on same group",0);
  }
  IVar10 = pnga_pgroup_nodeid(grp);
  IVar11 = pnga_total_blocks(g_a);
  IVar12 = pnga_total_blocks(g_b);
  if ((((-1 < IVar11) || (-1 < IVar12)) || (lVar13 = pnga_compare_distr(g_a,g_b), lVar13 == 0)) ||
     ((lVar13 = pnga_has_ghosts(g_a), lVar13 != 0 || (lVar13 = pnga_has_ghosts(g_b), lVar13 != 0))))
  {
    pnga_inquire(g_a,&type,_hi,_dims);
    pnga_inquire(g_b,&type,_ld,_lo);
    pnga_dot_patch(g_a,"n",one_arr,_dims,g_b,"n",one_arr,_lo,local_130);
    return;
  }
  pnga_pgroup_sync(grp);
  pnga_inquire(g_a,&type,&ndim,_dims);
  if (type != Type) {
    pnga_error("type not correct",g_a);
  }
  pnga_distribution(g_a,IVar10,_lo,_hi);
  if (_lo[0] < 1) {
    lVar19 = 0;
  }
  else {
    pnga_access_ptr(g_a,_lo,_hi,&ptr_a,_ld);
    lVar13 = pnga_has_ghosts(g_a);
    lVar19 = (_hi[ndim + -1] - _lo[ndim + -1]) + 1;
    if (lVar13 == 0) {
      if (1 < ndim) {
        lVar18 = 0;
        lVar17 = ndim;
        do {
          lVar20 = (_hi[lVar18] - _lo[lVar18]) + 1;
          if (_ld[lVar18] != lVar20) {
            pnga_error("layout problem",lVar18);
            lVar20 = (_hi[lVar18] - _lo[lVar18]) + 1;
            lVar17 = ndim;
          }
          lVar19 = lVar19 * lVar20;
          lVar18 = lVar18 + 1;
        } while (lVar18 < lVar17 + -1);
      }
    }
    else if (1 < ndim) {
      lVar18 = 0;
      lVar17 = ndim;
      do {
        lVar20 = _hi[lVar18];
        lVar14 = _lo[lVar18];
        if (_ld[lVar18] <= lVar20 - lVar14) {
          pnga_error("layout problem with ghosts",lVar18);
          lVar20 = _hi[lVar18];
          lVar14 = _lo[lVar18];
          lVar17 = ndim;
        }
        lVar19 = lVar19 * ((lVar20 - lVar14) + 1);
        lVar18 = lVar18 + 1;
      } while (lVar18 < lVar17 + -1);
    }
  }
  if (g_a == g_b) {
    ptr_b = ptr_a;
    lVar17 = lVar19;
  }
  else {
    pnga_inquire(g_b,&type,&ndim,_dims);
    if (type != Type) {
      pnga_error("type not correct",g_b);
    }
    pnga_distribution(g_b,IVar10,_lo,_hi);
    if (_lo[0] < 1) {
      lVar17 = 0;
    }
    else {
      pnga_access_ptr(g_b,_lo,_hi,&ptr_b,_ld);
      lVar13 = pnga_has_ghosts(g_b);
      lVar17 = (_hi[ndim + -1] - _lo[ndim + -1]) + 1;
      if (lVar13 == 0) {
        if (1 < ndim) {
          lVar20 = 0;
          lVar18 = ndim;
          do {
            lVar14 = (_hi[lVar20] - _lo[lVar20]) + 1;
            if (_ld[lVar20] != lVar14) {
              pnga_error("layout problem",lVar20);
              lVar14 = (_hi[lVar20] - _lo[lVar20]) + 1;
              lVar18 = ndim;
            }
            lVar17 = lVar17 * lVar14;
            lVar20 = lVar20 + 1;
          } while (lVar20 < lVar18 + -1);
        }
      }
      else if (1 < ndim) {
        lVar20 = 0;
        lVar18 = ndim;
        do {
          lVar14 = _hi[lVar20];
          lVar16 = _lo[lVar20];
          if (_ld[lVar20] <= lVar14 - lVar16) {
            pnga_error("layout problem with ghosts",lVar20);
            lVar14 = _hi[lVar20];
            lVar16 = _lo[lVar20];
            lVar18 = ndim;
          }
          lVar17 = lVar17 * ((lVar14 - lVar16) + 1);
          lVar20 = lVar20 + 1;
        } while (lVar20 < lVar18 + -1);
      }
    }
  }
  if (lVar19 - lVar17 != 0) {
    pnga_error("inconsistent number of elements",lVar19 - lVar17);
  }
  x = local_130;
  switch(type) {
  case 0x3e9:
    if (lVar19 < 1) {
      iVar15 = 0;
    }
    else {
      lVar17 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + *(int *)((long)ptr_b + lVar17 * 4) * *(int *)((long)ptr_a + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar19 != lVar17);
    }
    *(int *)*local_130 = iVar15;
    type = 0x3e9;
    break;
  case 0x3ea:
    if (lVar19 < 1) {
      lVar17 = 0;
    }
    else {
      lVar18 = 0;
      lVar17 = 0;
      do {
        lVar17 = lVar17 + *(long *)((long)ptr_b + lVar18 * 8) * *(long *)((long)ptr_a + lVar18 * 8);
        lVar18 = lVar18 + 1;
      } while (lVar19 != lVar18);
    }
    *(long *)*local_130 = lVar17;
    type = 0x3ea;
    break;
  case 0x3eb:
    if (lVar19 < 1) {
      fVar21 = 0.0;
    }
    else {
      fVar21 = 0.0;
      lVar17 = 0;
      do {
        fVar21 = fVar21 + *(float *)((long)ptr_a + lVar17 * 4) *
                          *(float *)((long)ptr_b + lVar17 * 4);
        lVar17 = lVar17 + 1;
      } while (lVar19 != lVar17);
    }
    *(float *)*local_130 = fVar21;
    type = 0x3eb;
    break;
  case 0x3ec:
    if (lVar19 < 1) {
      dVar6 = 0.0;
    }
    else {
      dVar6 = 0.0;
      lVar17 = 0;
      do {
        dVar6 = dVar6 + *(double *)((long)ptr_a + lVar17 * 8) *
                        *(double *)((long)ptr_b + lVar17 * 8);
        lVar17 = lVar17 + 1;
      } while (lVar19 != lVar17);
    }
    *(double *)*local_130 = dVar6;
    type = 0x3ec;
    break;
  default:
    pnga_error(" wrong data type ",type);
    iVar15 = 0;
    goto LAB_0011effb;
  case 0x3ee:
    if (lVar19 < 1) {
      fVar21 = 0.0;
      fVar22 = 0.0;
    }
    else {
      fVar21 = 0.0;
      fVar22 = 0.0;
      lVar17 = 0;
      do {
        fVar1 = *(float *)((long)ptr_b + lVar17 * 8);
        fVar2 = *(float *)((long)ptr_b + lVar17 * 8 + 4);
        uVar4 = *(undefined8 *)((long)ptr_a + lVar17 * 8);
        fVar23 = (float)uVar4;
        fVar24 = (float)((ulong)uVar4 >> 0x20);
        fVar21 = fVar21 + fVar1 * fVar23 + fVar24 * -fVar2;
        fVar22 = fVar22 + fVar1 * fVar24 + fVar23 * fVar2;
        lVar17 = lVar17 + 1;
      } while (lVar19 != lVar17);
    }
    *(ulong *)*local_130 = CONCAT44(fVar22,fVar21);
    type = 0x3ee;
    goto LAB_0011eff6;
  case 0x3ef:
    if (lVar19 < 1) {
      dVar6 = 0.0;
      dVar7 = 0.0;
    }
    else {
      dVar6 = 0.0;
      dVar7 = 0.0;
      lVar18 = 0;
      lVar17 = lVar19;
      do {
        dVar3 = *(double *)((long)ptr_b + lVar18 + 8);
        dVar8 = *(double *)((long)ptr_a + lVar18);
        dVar9 = ((double *)((long)ptr_a + lVar18))[1];
        dVar6 = dVar6 + *(double *)((long)ptr_b + lVar18) * dVar8 + dVar9 * -dVar3;
        dVar7 = dVar7 + *(double *)((long)ptr_b + lVar18) * dVar9 + dVar8 * dVar3;
        lVar18 = lVar18 + 0x10;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    auVar5._8_4_ = SUB84(dVar7,0);
    auVar5._0_8_ = dVar6;
    auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
    *local_130 = auVar5;
    type = 0x3ef;
LAB_0011eff6:
    iVar15 = 2;
    goto LAB_0011effb;
  case 0x3f8:
    if (lVar19 < 1) {
      lVar17 = 0;
    }
    else {
      lVar18 = 0;
      lVar17 = 0;
      do {
        lVar17 = lVar17 + *(long *)((long)ptr_b + lVar18 * 8) * *(long *)((long)ptr_a + lVar18 * 8);
        lVar18 = lVar18 + 1;
      } while (lVar19 != lVar18);
    }
    *(long *)*local_130 = lVar17;
    type = 0x3f8;
  }
  iVar15 = 1;
LAB_0011effb:
  if ((0 < lVar19) && (pnga_release(g_a,_lo,_hi), g_a != g_b)) {
    pnga_release(g_b,_lo,_hi);
  }
  if ((type - 0x3e9U < 0x10) && ((0x806fU >> ((uint)(type - 0x3e9U) & 0x1f) & 1) != 0)) {
    type_00 = *(int *)(" pnga_ddot_patch_dp: transpose operators don\'t match: " + type * 4 + 0x1a);
  }
  else {
    pnga_error("pnga_dot: type not supported",type);
    type_00 = 0;
  }
  lVar13 = pnga_is_mirrored(g_a);
  if ((lVar13 == 0) || (lVar13 = pnga_is_mirrored(g_b), lVar13 == 0)) {
    if (grp != -1) {
      group = ga_get_armci_group_((int)grp);
      armci_msg_group_gop_scope(0x14d,x,iVar15,"+",type_00,group);
      return;
    }
    scope = 0x14d;
  }
  else {
    scope = 0x151;
  }
  armci_msg_gop_scope(scope,x,iVar15,"+",type_00);
  return;
}

Assistant:

void pnga_dot(int Type, Integer g_a, Integer g_b, void *value)
{
Integer  ndim=0, type=0, atype=0, me=0, elems=0, elemsb=0;
register Integer i=0;
int isum=0;
long lsum=0;
long long llsum=0;
DoubleComplex zsum ={0.,0.};
SingleComplex csum ={0.,0.};
float fsum=0.0;
void *ptr_a=NULL, *ptr_b=NULL;
int alen=0;
Integer a_grp=0, b_grp=0;
Integer num_blocks_a=0, num_blocks_b=0;

Integer _dims[MAXDIM];
Integer _ld[MAXDIM-1];
Integer _lo[MAXDIM];
Integer _hi[MAXDIM];
Integer andim, adims[MAXDIM];
Integer bndim, bdims[MAXDIM];

   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/

   a_grp = pnga_get_pgroup(g_a);
   b_grp = pnga_get_pgroup(g_b);
   if (a_grp != b_grp)
     pnga_error("Both arrays must be defined on same group",0L);
   me = pnga_pgroup_nodeid(a_grp);

   /* Check to see if either GA is block cyclic distributed */
   num_blocks_a = pnga_total_blocks(g_a);
   num_blocks_b = pnga_total_blocks(g_b);
   if (num_blocks_a >= 0 || num_blocks_b >= 0) {
     pnga_inquire(g_a, &type, &andim, adims);
     pnga_inquire(g_b, &type, &bndim, bdims);
     pnga_dot_patch(g_a, "n", one_arr, adims, g_b, "n", one_arr, bdims,
         value);
     return;
   }

   if(pnga_compare_distr(g_a,g_b) == FALSE ||
      pnga_has_ghosts(g_a) || pnga_has_ghosts(g_b)) {
       /* distributions not identical */
       pnga_inquire(g_a, &type, &andim, adims);
       pnga_inquire(g_b, &type, &bndim, bdims);

       pnga_dot_patch(g_a, "n", one_arr, adims, g_b, "n", one_arr, bdims,
                      value);
       
       return;
   }
   
   pnga_pgroup_sync(a_grp);
   pnga_inquire(g_a,  &type, &ndim, _dims);
   if(type != Type) pnga_error("type not correct", g_a);
   pnga_distribution(g_a, me, _lo, _hi);
   if(_lo[0]>0){
      pnga_access_ptr(g_a, _lo, _hi, &ptr_a, _ld);
      if (pnga_has_ghosts(g_a)) {
        GET_ELEMS_W_GHOSTS(ndim,_lo,_hi,_ld,&elems);
      } else {
        GET_ELEMS(ndim,_lo,_hi,_ld,&elems);
      }
   }

   if(g_a == g_b){
     elemsb = elems;
     ptr_b = ptr_a;
   }else {  
     pnga_inquire(g_b,  &type, &ndim, _dims);
     if(type != Type) pnga_error("type not correct", g_b);
     pnga_distribution(g_b, me, _lo, _hi);
     if(_lo[0]>0){
        pnga_access_ptr(g_b, _lo, _hi, &ptr_b, _ld);
        if (pnga_has_ghosts(g_b)) {
          GET_ELEMS_W_GHOSTS(ndim,_lo,_hi,_ld,&elemsb);
        } else {
          GET_ELEMS(ndim,_lo,_hi,_ld,&elemsb);
        }
     }
   }

   if(elems!= elemsb)pnga_error("inconsistent number of elements",elems-elemsb); 


      /* compute "local" contribution to the dot product */
      switch (type){
	int *ia, *ib;
	double *da,*db;
        float *fa, *fb;
        long *la,*lb;
        long long *lla,*llb;
        case C_INT:
           ia = (int*)ptr_a;
           ib = (int*)ptr_b;
           for(i=0;i<elems;i++) 
                 isum += ia[i]  * ib[i];
           *(int*)value = isum; 
           type = C_INT;
           alen = 1;
           break;

        case C_DCPL:
           for(i=0;i<elems;i++){
               DoubleComplex a = ((DoubleComplex*)ptr_a)[i];
               DoubleComplex b = ((DoubleComplex*)ptr_b)[i];
               zsum.real += a.real*b.real  - b.imag * a.imag;
               zsum.imag += a.imag*b.real  + b.imag * a.real;
           }
           *(DoubleComplex*)value = zsum; 
           type = C_DCPL;
           alen = 2;
           break;

        case C_SCPL:
           for(i=0;i<elems;i++){
               SingleComplex a = ((SingleComplex*)ptr_a)[i];
               SingleComplex b = ((SingleComplex*)ptr_b)[i];
               csum.real += a.real*b.real  - b.imag * a.imag;
               csum.imag += a.imag*b.real  + b.imag * a.real;
           }
           *(SingleComplex*)value = csum; 
           type = C_SCPL;
           alen = 2;
           break;

        case C_DBL:
           da = (double*)ptr_a;
           db = (double*)ptr_b;
           for(i=0;i<elems;i++) 
                 zsum.real += da[i]  * db[i];
           *(double*)value = zsum.real; 
           type = C_DBL;
           alen = 1;
           break;
        case C_FLOAT:
           fa = (float*)ptr_a;
           fb = (float*)ptr_b;
           for(i=0;i<elems;i++)
                 fsum += fa[i]  * fb[i];
           *(float*)value = fsum;
           type = C_FLOAT;
           alen = 1;
           break;         
        case C_LONG:
           la = (long*)ptr_a;
           lb = (long*)ptr_b;
           for(i=0;i<elems;i++)
		lsum += la[i]  * lb[i];
           *(long*)value = lsum;
           type = C_LONG;
           alen = 1;
           break;               
        case C_LONGLONG:
           lla = (long long*)ptr_a;
           llb = (long long*)ptr_b;
           for(i=0;i<elems;i++)
		llsum += lla[i]  * llb[i];
           *(long long*)value = llsum;
           type = C_LONGLONG;
           alen = 1;
           break;               
        default: pnga_error(" wrong data type ",type);
      }
   
      /* release access to the data */
      if(elems>0){
         pnga_release(g_a, _lo, _hi);
         if(g_a != g_b)pnga_release(g_b, _lo, _hi);
      }

    /*convert from C data type to ARMCI type */
    switch(type) {
      case C_FLOAT: atype=ARMCI_FLOAT; break;
      case C_DBL: atype=ARMCI_DOUBLE; break;
      case C_INT: atype=ARMCI_INT; break;
      case C_LONG: atype=ARMCI_LONG; break;
      case C_LONGLONG: atype=ARMCI_LONG_LONG; break;
      case C_DCPL: atype=ARMCI_DOUBLE; break;
      case C_SCPL: atype=ARMCI_FLOAT; break;
      default: pnga_error("pnga_dot: type not supported",type);
    }

   if (pnga_is_mirrored(g_a) && pnga_is_mirrored(g_b)) {
     armci_msg_gop_scope(SCOPE_NODE,value,alen,"+",atype);
   } else {
     if (a_grp == -1) {
       armci_msg_gop_scope(SCOPE_ALL,value,alen,"+",atype);
#ifdef MSG_COMMS_MPI
     } else {
       armci_msg_group_gop_scope(SCOPE_ALL,value,alen,"+",atype,
           ga_get_armci_group_((int)a_grp));
#endif
     }
   }
    

}